

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cchoose.c
# Opt level: O0

char * cwhen_openTag(FILE *out,char *line)

{
  int iVar1;
  csafestring_t *pcVar2;
  char *pcVar3;
  size_t in_RSI;
  FILE *in_RDI;
  _Bool *data;
  csafestring_t *test;
  csafestring_t *in_stack_fffffffffffffff8;
  
  pcVar2 = modules_extractVariable((char *)test,data);
  if (pcVar2 == (csafestring_t *)0x0) {
    safe_destroy((csafestring_t *)0x106731);
    pcVar3 = modules_findEndOfTag((char *)0x10673b);
  }
  else {
    if ((*module_cchoose.data & 1) == 0) {
      fprintf(in_RDI,"else if ( ");
    }
    else {
      *(undefined1 *)module_cchoose.data = 0;
      fprintf(in_RDI,"if ( ");
    }
    iVar1 = safe_strncmp(in_stack_fffffffffffffff8,(char *)in_RDI,in_RSI);
    if (iVar1 == 0) {
      expression_eval((FILE *)data,(char *)in_stack_fffffffffffffff8,SUB81((ulong)in_RDI >> 0x38,0))
      ;
    }
    else {
      fprintf(in_RDI,"%s",pcVar2->data);
    }
    fprintf(in_RDI," ) {\n");
    safe_destroy((csafestring_t *)0x1067ea);
    pcVar3 = modules_findEndOfTag((char *)0x1067f4);
  }
  return pcVar3 + 1;
}

Assistant:

static char *cwhen_openTag(FILE *out, char *line) {
	csafestring_t *test = modules_extractVariable(line, "test");
	bool *data = (bool *) module_cchoose.data;

	if ( test == NULL ) {
		safe_destroy(test);
		return modules_findEndOfTag(line) + 1;
	}

	if ( *data ) {
		*data = false;
		fprintf(out, "if ( ");
	} else {
		fprintf(out, "else if ( ");
	}
	if ( !safe_strncmp(test, "${", 2) ) {
		expression_eval(out, test->data, false);
	} else {
		fprintf(out, "%s", test->data);
	}
	fprintf(out, " ) {\n");

	safe_destroy(test);
	return modules_findEndOfTag(line) + 1;
}